

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_taylor.cpp
# Opt level: O3

int taylor_check<double,2,2>(char *label,taylor<double,_2,_2> *t,num_t *correct,num_t thres)

{
  double *pdVar1;
  ostream *poVar2;
  undefined8 extraout_RAX;
  int i;
  long lVar3;
  double dVar4;
  ostringstream errmsg;
  ostringstream message;
  string local_3e8;
  num_t local_3c8;
  char *local_3c0;
  long local_3b8;
  char local_3b0 [16];
  char *local_3a0;
  long local_398;
  char local_390 [16];
  char *local_380;
  long local_378;
  char local_370 [16];
  char *local_360;
  long local_358;
  char local_350 [16];
  char *local_340;
  long local_338;
  char local_330 [16];
  char *local_320;
  long local_318;
  char local_310 [96];
  ios_base local_2b0 [264];
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  lVar3 = 0;
  local_3c8 = thres;
  do {
    i = (int)lVar3;
    pdVar1 = taylor<double,_2,_2>::operator[](t,i);
    dVar4 = ABS(*pdVar1 - correct[lVar3]);
    if (local_3c8 < (dVar4 + dVar4) / (ABS(correct[lVar3]) + 1.0)) {
      std::__cxx11::ostringstream::ostringstream(local_1a8);
      local_320 = local_310;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_320,"Error in coefficient ","");
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1a8,local_320,local_318);
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,i);
      local_3e8._M_dataplus._M_p = (pointer)&local_3e8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_3e8," of ","");
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar2,local_3e8._M_dataplus._M_p,local_3e8._M_string_length);
      std::__cxx11::string::string((string *)&local_360,label,(allocator *)&local_340);
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,local_360,local_358);
      local_380 = local_370;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_380,". Correct:","");
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,local_380,local_378);
      poVar2 = std::ostream::_M_insert<double>(correct[lVar3]);
      local_3a0 = local_390;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_3a0,", taylor:","");
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,local_3a0,local_398);
      pdVar1 = taylor<double,_2,_2>::operator[](t,i);
      poVar2 = std::ostream::_M_insert<double>(*pdVar1);
      local_3c0 = local_3b0;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_3c0," error: ","");
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,local_3c0,local_3b8);
      local_3c8 = correct[lVar3];
      pdVar1 = taylor<double,_2,_2>::operator[](t,i);
      std::ostream::_M_insert<double>(local_3c8 - *pdVar1);
      if (local_3c0 != local_3b0) {
        operator_delete(local_3c0);
      }
      if (local_3a0 != local_390) {
        operator_delete(local_3a0);
      }
      if (local_380 != local_370) {
        operator_delete(local_380);
      }
      if (local_360 != local_350) {
        operator_delete(local_360);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3e8._M_dataplus._M_p != &local_3e8.field_2) {
        operator_delete(local_3e8._M_dataplus._M_p);
      }
      if (local_320 != local_310) {
        operator_delete(local_320);
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_320);
      local_3e8._M_dataplus._M_p = (pointer)&local_3e8.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_3e8,"Taylor fatal error.\n","");
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&local_320,local_3e8._M_dataplus._M_p,
                          local_3e8._M_string_length);
      local_360 = local_350;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_360," In function ","");
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,local_360,local_358);
      local_380 = local_370;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_380,"taylor_check","");
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,local_380,local_378);
      local_3a0 = local_390;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_3a0," at line ","");
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,local_3a0,local_398);
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0x87);
      local_3c0 = local_3b0;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_3c0," of file ","");
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,local_3c0,local_3b8);
      local_340 = local_330;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_340,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/uekstrom[P]libtaylor/tests/unittest_taylor.cpp"
                 ,"");
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,local_340,local_338);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
      std::ostream::put((char)poVar2);
      std::ostream::flush();
      if (local_340 != local_330) {
        operator_delete(local_340);
      }
      if (local_3c0 != local_3b0) {
        operator_delete(local_3c0);
      }
      if (local_3a0 != local_390) {
        operator_delete(local_3a0);
      }
      if (local_380 != local_370) {
        operator_delete(local_380);
      }
      if (local_360 != local_350) {
        operator_delete(local_360);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3e8._M_dataplus._M_p != &local_3e8.field_2) {
        operator_delete(local_3e8._M_dataplus._M_p);
      }
      std::__cxx11::stringbuf::str();
      message_and_die(&local_3e8,(ostringstream *)local_1a8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3e8._M_dataplus._M_p != &local_3e8.field_2) {
        operator_delete(local_3e8._M_dataplus._M_p);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_320);
      std::ios_base::~ios_base(local_2b0);
      std::__cxx11::ostringstream::~ostringstream(local_1a8);
      std::ios_base::~ios_base(local_138);
      _Unwind_Resume(extraout_RAX);
    }
    lVar3 = lVar3 + 1;
  } while (lVar3 != 6);
  return 0;
}

Assistant:

int taylor_check(const char * label,
                 const taylor<T, Nvar, Ndeg> & t,
                 const num_t correct[],
                 num_t thres) {
  int nfail = 0;
  for (int i = 0; i < NR_COEFF_CHECK; i++) {
    T err = 2 * std::abs(t[i] - correct[i]) / (1 + std::abs(correct[i]));
    if (err > thres) {
      std::ostringstream message;
      message << std::string("Error in coefficient ") << i << std::string(" of ")
              << std::string(label) << std::string(". Correct:") << correct[i]
              << std::string(", taylor:") << t[i] << std::string(" error: ")
              << correct[i] - t[i];
      TAYLOR_ERROR(message);
      nfail++;
    }
  }
  return nfail;
}